

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O1

Pattern * __thiscall OrPattern::doAnd(OrPattern *this,Pattern *b,int4 sa)

{
  pointer ppDVar1;
  int iVar2;
  long lVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  OrPattern *this_00;
  pointer ppDVar4;
  undefined8 *puVar5;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> newlist;
  DisjointPattern *tmp;
  vector<DisjointPattern_*,_std::allocator<DisjointPattern_*>_> local_58;
  OrPattern *local_40;
  DisjointPattern *local_38;
  
  local_40 = this;
  if (b == (Pattern *)0x0) {
    lVar3 = 0;
  }
  else {
    lVar3 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (DisjointPattern **)0x0;
  local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (DisjointPattern **)0x0;
  ppDVar4 = (local_40->orlist).
            super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppDVar1 = (local_40->orlist).
            super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (lVar3 == 0) {
    if (ppDVar4 != ppDVar1) {
      do {
        iVar2 = (*((*ppDVar4)->super_Pattern)._vptr_Pattern[5])(*ppDVar4,b,(ulong)(uint)sa);
        local_38 = (DisjointPattern *)CONCAT44(extraout_var_00,iVar2);
        if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
          _M_realloc_insert<DisjointPattern*const&>
                    ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_38;
          local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        ppDVar4 = ppDVar4 + 1;
      } while (ppDVar4 !=
               (local_40->orlist).
               super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
  }
  else if (ppDVar4 != ppDVar1) {
    do {
      for (puVar5 = *(undefined8 **)(lVar3 + 8); puVar5 != *(undefined8 **)(lVar3 + 0x10);
          puVar5 = puVar5 + 1) {
        iVar2 = (*((*ppDVar4)->super_Pattern)._vptr_Pattern[5])(*ppDVar4,*puVar5,(ulong)(uint)sa);
        local_38 = (DisjointPattern *)CONCAT44(extraout_var,iVar2);
        if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_finish ==
            local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<DisjointPattern*,std::allocator<DisjointPattern*>>::
          _M_realloc_insert<DisjointPattern*const&>
                    ((vector<DisjointPattern*,std::allocator<DisjointPattern*>> *)&local_58,
                     (iterator)
                     local_58.
                     super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&local_38);
        }
        else {
          *local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
           _M_impl.super__Vector_impl_data._M_finish = local_38;
          local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl
          .super__Vector_impl_data._M_finish =
               local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      ppDVar4 = ppDVar4 + 1;
    } while (ppDVar4 !=
             (local_40->orlist).
             super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  this_00 = (OrPattern *)operator_new(0x20);
  OrPattern(this_00,&local_58);
  if (local_58.super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_58.
                    super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return &this_00->super_Pattern;
}

Assistant:

Pattern *OrPattern::doAnd(const Pattern *b,int4 sa) const

{
  const OrPattern *b2 = dynamic_cast<const OrPattern *>(b);
  vector<DisjointPattern *> newlist;
  vector<DisjointPattern *>::const_iterator iter,iter2;
  DisjointPattern *tmp;
  OrPattern *tmpor;

  if (b2 == (const OrPattern *)0) {
    for(iter=orlist.begin();iter!=orlist.end();++iter) {
      tmp = (DisjointPattern *)(*iter)->doAnd(b,sa);
      newlist.push_back(tmp);
    }
  }
  else {
    for(iter=orlist.begin();iter!=orlist.end();++iter)
      for(iter2=b2->orlist.begin();iter2!=b2->orlist.end();++iter2) {
	tmp = (DisjointPattern *)(*iter)->doAnd(*iter2,sa);
	newlist.push_back(tmp);
      }
  }
  tmpor = new OrPattern(newlist);
  return tmpor;
}